

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadMemory(BinaryReader *this,Limits *out_page_limits)

{
  uint uVar1;
  Result RVar2;
  Enum EVar3;
  uint32_t max;
  uint32_t initial;
  uint32_t flags;
  uint32_t local_34;
  uint local_30;
  uint local_2c;
  
  local_34 = 0;
  RVar2 = ReadU32Leb128(this,&local_2c,"memory flags");
  EVar3 = Error;
  if ((RVar2.enum_ != Error) &&
     (RVar2 = ReadU32Leb128(this,&local_30,"memory initial page count"), RVar2.enum_ != Error)) {
    uVar1 = 0;
    if (((local_2c & 1) == 0) ||
       (RVar2 = ReadU32Leb128(this,&local_34,"memory max page count"), uVar1 = local_34,
       RVar2.enum_ != Error)) {
      out_page_limits->has_max = SUB41(local_2c & 1,0);
      out_page_limits->is_shared = (bool)((byte)local_2c >> 1 & 1);
      out_page_limits->initial = (ulong)local_30;
      out_page_limits->max = (ulong)uVar1;
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReader::ReadMemory(Limits* out_page_limits) {
  uint32_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU32Leb128(&flags, "memory flags"));
  CHECK_RESULT(ReadU32Leb128(&initial, "memory initial page count"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "memory max page count"));
  }

  out_page_limits->has_max = has_max;
  out_page_limits->is_shared = is_shared;
  out_page_limits->initial = initial;
  out_page_limits->max = max;
  return Result::Ok;
}